

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O0

vector<Tle,_std::allocator<Tle>_> * __thiscall
DBSQLite::fetchTLEs(vector<Tle,_std::allocator<Tle>_> *__return_storage_ptr__,DBSQLite *this)

{
  sqlite3 *psVar1;
  int iVar2;
  _func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr *p_Var3;
  ostream *poVar4;
  char *pcVar5;
  __0 local_29;
  char *pcStack_28;
  anon_class_1_0_00000001 cb;
  char *q;
  DBSQLite *this_local;
  vector<Tle,_std::allocator<Tle>_> *tles;
  
  std::vector<Tle,_std::allocator<Tle>_>::vector(__return_storage_ptr__);
  pcStack_28 = "SELECT name, line1, line2 FROM tle;";
  psVar1 = this->_sql;
  p_Var3 = fetchTLEs()::$_0::operator_cast_to_function_pointer(&local_29);
  iVar2 = sqlite3_exec(psVar1,"SELECT name, line1, line2 FROM tle;",p_Var3,__return_storage_ptr__,0)
  ;
  if (iVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[-] Error querying database: ");
    pcVar5 = (char *)sqlite3_errmsg(this->_sql);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tle> DBSQLite::fetchTLEs() {
  std::vector<Tle> tles;
  const char *q = "SELECT name, line1, line2 FROM tle;";
  auto cb = [](void *tleptr, int nCols, char **row, char **colName) {
    auto tles = static_cast<std::vector<Tle> *>(tleptr);
    if (nCols != 3)
      return SQLITE_OK;
    std::string name(row[0]);
    std::string line1(row[1]);
    std::string line2(row[2]);
    if (name.size())
      tles->emplace_back(name, line1, line2);
    else
      tles->emplace_back(name, line1, line2);
    return SQLITE_OK;
  };

  if (sqlite3_exec(_sql, q, cb, &tles, nullptr)) {
    std::cerr << "[-] Error querying database: " << sqlite3_errmsg(_sql)
              << std::endl;
    return tles;
  }

  return tles;
}